

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_16x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  ushort uVar10;
  ushort uVar17;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar11 [16];
  ushort uVar21;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 uVar16;
  byte bVar18;
  
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)left;
  auVar11 = psadbw((undefined1  [16])0x0,auVar9);
  uVar10 = auVar11._0_2_ + 4;
  uVar17 = auVar11._2_2_ + 4;
  uVar19 = auVar11._4_2_ + 4;
  uVar20 = auVar11._6_2_ + 4;
  auVar12._0_2_ = uVar10 >> 3;
  uVar21 = uVar20 >> 3;
  uVar1 = CONCAT22((ushort)(auVar11._8_2_ + 4U) >> 3,uVar21);
  auVar13._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar11._10_2_ + 4U) >> 3,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar14._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar11._12_2_ + 4U) >> 3,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar15._0_13_ = auVar5 << 0x30;
  bVar18 = (byte)(uVar20 >> 8);
  auVar15._14_2_ = (undefined2)(CONCAT19(bVar18 >> 3,CONCAT18(bVar18 >> 3,uVar3)) >> 0x40);
  auVar15[0xd] = (char)uVar21;
  bVar18 = (byte)(uVar19 >> 0xb);
  auVar14._12_4_ = (undefined4)(CONCAT37(auVar15._13_3_,CONCAT16((char)uVar21,uVar2)) >> 0x30);
  auVar14[0xb] = bVar18;
  uVar16 = (undefined1)(uVar19 >> 3);
  auVar13._10_6_ = (undefined6)(CONCAT55(auVar14._11_5_,CONCAT14(bVar18,uVar1)) >> 0x20);
  auVar13[9] = uVar16;
  bVar18 = (byte)(uVar17 >> 0xb);
  auVar12._8_8_ = (undefined8)(CONCAT73(auVar13._9_7_,CONCAT12(uVar16,uVar21)) >> 0x10);
  auVar12[7] = bVar18;
  auVar12[6] = bVar18;
  uVar16 = (undefined1)(uVar17 >> 3);
  auVar12[5] = uVar16;
  auVar12[4] = uVar16;
  bVar18 = (byte)(uVar10 >> 8);
  auVar12[3] = bVar18 >> 3;
  auVar12[2] = bVar18 >> 3;
  auVar11[0] = (undefined1)auVar12._0_2_;
  auVar11._2_14_ = auVar12._2_14_;
  auVar11[1] = auVar11[0];
  auVar9 = pshuflw(auVar9,auVar11,0);
  uVar8 = auVar9._0_4_;
  iVar6 = 8;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    *(undefined4 *)dst = uVar8;
    *(undefined4 *)(dst + 4) = uVar8;
    *(undefined4 *)(dst + 8) = uVar8;
    *(undefined4 *)(dst + 0xc) = uVar8;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_left_predictor_16x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_8(left);
  const __m128i four = _mm_set1_epi16(4);
  sum_left = _mm_add_epi16(sum_left, four);
  sum_left = _mm_srai_epi16(sum_left, 3);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_16xh(&row, 8, dst, stride);
}